

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void * __thiscall CASC_ARRAY::InsertAt(CASC_ARRAY *this,size_t ItemIndex)

{
  bool bVar1;
  LPBYTE __s;
  long lVar2;
  
  lVar2 = ItemIndex - this->m_ItemCount;
  if (this->m_ItemCount <= ItemIndex && lVar2 != 0) {
    bVar1 = EnlargeArray(this,ItemIndex);
    if (bVar1) {
      __s = this->m_pItemArray + this->m_ItemSize * this->m_ItemCount;
      this->m_ItemCount = this->m_ItemCount + lVar2;
    }
    else {
      __s = (LPBYTE)0x0;
    }
    if (__s == (LPBYTE)0x0) {
      return (void *)0x0;
    }
    memset(__s,0,lVar2 * this->m_ItemSize);
  }
  if ((this->m_ItemCount == ItemIndex) && (bVar1 = EnlargeArray(this,this->m_ItemCount + 1), bVar1))
  {
    this->m_ItemCount = this->m_ItemCount + 1;
  }
  if (ItemIndex < this->m_ItemCount) {
    return this->m_pItemArray + ItemIndex * this->m_ItemSize;
  }
  __assert_fail("ItemIndex < m_ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Array.h"
                ,0x40,"void *CASC_ARRAY::ItemAt(size_t)");
}

Assistant:

void * InsertAt(size_t ItemIndex)
    {
        void * pNewItem;
        size_t AddedItemCount;

        // Is there enough items?
        if (ItemIndex > m_ItemCount)
        {
            // Capture the new item count
            AddedItemCount = ItemIndex - m_ItemCount;

            // Insert the amount of items
            pNewItem = Insert(NULL, AddedItemCount);
            if (pNewItem == NULL)
                return NULL;

            // Zero the inserted items
            memset(pNewItem, 0, m_ItemSize * AddedItemCount);
        }

        // Is the item already inserted?
        if (ItemIndex == m_ItemCount)
        {
            Insert(NULL, 1);
        }

        // Return the item at a given index
        return ItemAt(ItemIndex);
    }